

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O2

int __thiscall
EventDispatcherHelper::addEventListener
          (EventDispatcherHelper *this,IEventListener *listener,int event_id)

{
  EventListenerNode *node;
  AutoLock _auto_lock_;
  
  AutoLock::AutoLock(&_auto_lock_,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                     ,0x66);
  node = (EventListenerNode *)
         operator_new(0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                      ,0x68);
  node->mListener = listener;
  node->mEventId = event_id;
  JetHead::list<EventDispatcherHelper::EventListenerNode_*>::push_back(&this->mEventList,&node);
  AutoLock::~AutoLock(&_auto_lock_);
  return 0;
}

Assistant:

int EventDispatcherHelper::addEventListener( IEventListener *listener, int event_id )
{
	DebugAutoLock( mLock );
	
	EventListenerNode *node = jh_new EventListenerNode;
	
	node->mListener = listener;
	node->mEventId = event_id;
	
	mEventList.push_back( node );

	return 0;
}